

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_boundary_at_node(REF_GRID ref_grid,REF_INT node)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  uint uVar1;
  uint uVar2;
  long lVar3;
  REF_INT local_190;
  REF_INT local_18c;
  int local_188;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reib_bi;
  REF_LONG ref_private_status_reib_ai;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell_list [10];
  int local_134;
  uint local_130;
  REF_INT ncell;
  REF_INT node1;
  REF_INT node0;
  REF_INT ns [27];
  uint local_ac;
  REF_INT c;
  REF_INT i;
  REF_INT nodes [27];
  REF_INT cell_edge;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[3];
  if ((node < 0) || (ref_cell_00->ref_adj->nnode <= node)) {
    local_188 = -1;
  }
  else {
    local_188 = ref_cell_00->ref_adj->first[node];
  }
  cell_edge = local_188;
  if (local_188 == -1) {
    local_18c = -1;
  }
  else {
    local_18c = ref_cell_00->ref_adj->item[local_188].ref;
  }
  nodes[0x1a] = local_18c;
  do {
    if (cell_edge == -1) {
      return 0;
    }
    uVar1 = ref_cell_nodes(ref_cell_00,nodes[0x1a],&c);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x68,"ref_validation_boundary_at_node",(ulong)uVar1,"get cell");
      return uVar1;
    }
    for (nodes[0x19] = 0; nodes[0x19] < ref_cell_00->edge_per; nodes[0x19] = nodes[0x19] + 1) {
      ncell = ref_cell_00->c2n
              [ref_cell_00->e2n[nodes[0x19] << 1] + ref_cell_00->size_per * nodes[0x1a]];
      local_130 = ref_cell_00->c2n
                  [ref_cell_00->e2n[nodes[0x19] * 2 + 1] + ref_cell_00->size_per * nodes[0x1a]];
      if ((ref_node_00->ref_mpi->id == ref_node_00->part[ncell]) ||
         (ref_node_00->ref_mpi->id == ref_node_00->part[(int)local_130])) {
        uVar1 = ref_cell_list_with2(ref_cell_00,ncell,local_130,10,&local_134,
                                    &ref_private_macro_code_rsb);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x73,"ref_validation_boundary_at_node",(ulong)uVar1,
                 "more than ten triangles found with two nodes");
          printf("nodes %d %d faceid %d\n",(ulong)(uint)ncell,(ulong)local_130,(ulong)(uint)nodes[1]
                );
          ref_node_location(ref_node_00,ncell);
          ref_node_location(ref_node_00,local_130);
          return uVar1;
        }
        lVar3 = (long)local_134;
        if (lVar3 != 2) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x7e,"ref_validation_boundary_at_node","two triangles expected",2,lVar3);
          printf("nodes %d %d faceid %d\n",(ulong)(uint)ncell,(ulong)local_130,(ulong)(uint)nodes[1]
                );
          ref_node_location(ref_node_00,ncell);
          ref_node_location(ref_node_00,local_130);
          local_ac = 0;
          while( true ) {
            if (local_134 <= (int)local_ac) {
              return 1;
            }
            uVar1 = (&ref_private_macro_code_rsb)[(int)local_ac];
            uVar2 = ref_cell_nodes(ref_cell_00,uVar1,&node1);
            if (uVar2 != 0) break;
            lVar3 = CONCAT44((int)((ulong)lVar3 >> 0x20),ns[1]);
            printf(" item %d cell %d nodes %d %d %d id %d\n",(ulong)local_ac,(ulong)uVar1,
                   (ulong)(uint)node1,(ulong)(uint)node0,(ulong)(uint)ns[0],lVar3);
            local_ac = local_ac + 1;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x7a,"ref_validation_boundary_at_node",(ulong)uVar2,"get cell",lVar3);
          return uVar2;
        }
      }
    }
    cell_edge = ref_cell_00->ref_adj->item[cell_edge].next;
    if (cell_edge == -1) {
      local_190 = -1;
    }
    else {
      local_190 = ref_cell_00->ref_adj->item[cell_edge].ref;
    }
    nodes[0x1a] = local_190;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_boundary_at_node(REF_GRID ref_grid,
                                                   REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_edge, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT i, c, ns[REF_CELL_MAX_SIZE_PER];
  REF_INT node0, node1, ncell, cell_list[10];

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get cell");
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1))
        continue;
      RSB(ref_cell_list_with2(ref_cell, node0, node1, 10, &ncell, cell_list),
          "more than ten triangles found with two nodes", {
            printf("nodes %d %d faceid %d\n", node0, node1, nodes[3]);
            ref_node_location(ref_node, node0);
            ref_node_location(ref_node, node1);
          });
      REIB(2, ncell, "two triangles expected", {
        printf("nodes %d %d faceid %d\n", node0, node1, nodes[3]);
        ref_node_location(ref_node, node0);
        ref_node_location(ref_node, node1);
        for (i = 0; i < ncell; i++) {
          c = cell_list[i];
          RSS(ref_cell_nodes(ref_cell, c, ns), "get cell");
          printf(" item %d cell %d nodes %d %d %d id %d\n", i, c, ns[0], ns[1],
                 ns[2], ns[3]);
        }
      });
    }
  }

  return REF_SUCCESS;
}